

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

void __thiscall
pbrt::HomogeneousMedium::HomogeneousMedium
          (HomogeneousMedium *this,Spectrum *sigma_a,Spectrum *sigma_s,Float sigmaScale,Spectrum *Le
          ,Float LeScale,Float g,Allocator alloc)

{
  memory_resource *in_RDI;
  Float in_XMM2_Da;
  Spectrum *in_stack_ffffffffffffff48;
  Spectrum *in_stack_ffffffffffffff50;
  DenselySampledSpectrum *this_00;
  Float s;
  Allocator alloc_00;
  undefined1 local_40 [64];
  
  this_00 = (DenselySampledSpectrum *)local_40;
  alloc_00.memoryResource = in_RDI;
  local_40._8_4_ = in_XMM2_Da;
  Spectrum::Spectrum(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  DenselySampledSpectrum::DenselySampledSpectrum(this_00,(Spectrum *)in_RDI,alloc_00);
  Spectrum::Spectrum(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  DenselySampledSpectrum::DenselySampledSpectrum(this_00,(Spectrum *)in_RDI,alloc_00);
  Spectrum::Spectrum((Spectrum *)(in_RDI + 10),in_stack_ffffffffffffff48);
  DenselySampledSpectrum::DenselySampledSpectrum(this_00,(Spectrum *)in_RDI,alloc_00);
  s = (Float)((ulong)this_00 >> 0x20);
  HGPhaseFunction::HGPhaseFunction((HGPhaseFunction *)(in_RDI + 0xf),(Float)local_40._8_4_);
  DenselySampledSpectrum::Scale((DenselySampledSpectrum *)alloc_00.memoryResource,s);
  DenselySampledSpectrum::Scale((DenselySampledSpectrum *)alloc_00.memoryResource,s);
  DenselySampledSpectrum::Scale((DenselySampledSpectrum *)alloc_00.memoryResource,s);
  return;
}

Assistant:

HomogeneousMedium(Spectrum sigma_a, Spectrum sigma_s, Float sigmaScale, Spectrum Le,
                      Float LeScale, Float g, Allocator alloc)
        : sigma_a_spec(sigma_a, alloc),
          sigma_s_spec(sigma_s, alloc),
          Le_spec(Le, alloc),
          phase(g) {
        sigma_a_spec.Scale(sigmaScale);
        sigma_s_spec.Scale(sigmaScale);
        Le_spec.Scale(LeScale);
    }